

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.cpp
# Opt level: O1

void __thiscall
qclab::qgates::CX<float>::apply
          (CX<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281 f;
  int *local_50 [2];
  long local_40;
  anon_class_8_1_703dd281 local_38;
  
  (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject[5])
            (local_50,this);
  *local_50[0] = *local_50[0] + offset;
  local_50[0][1] = local_50[0][1] + offset;
  iVar1 = (this->super_QControlledGate2<float>).control_;
  iVar2 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
            _vptr_QObject[0xf])(this);
  local_38.vector = *(float **)vector;
  apply4<qclab::qgates::lambda_PauliX<float>(qclab::Op,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_50[0],local_50[0][1],iVar1 + offset,iVar2 + offset,
             (this->super_QControlledGate2<float>).controlState_,&local_38);
  if (local_50[0] != (int *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  return;
}

Assistant:

void CX< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                       const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_PauliX( op , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }